

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

size_t mtbdd_leafcount_mark(MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  while ((mtbdd & 0x7fffffffffffffff) != 0) {
    lVar4 = (mtbdd & 0xffffffffff) * 0x10;
    puVar1 = nodes->data;
    uVar2 = *(ulong *)(puVar1 + lVar4);
    if ((uVar2 & 0x2000000000000000) != 0) break;
    *(ulong *)(puVar1 + lVar4) = uVar2 | 0x2000000000000000;
    if ((uVar2 >> 0x3e & 1) != 0) {
      lVar4 = 1;
      goto LAB_00114909;
    }
    sVar3 = mtbdd_leafcount_mark(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff);
    lVar5 = lVar5 + sVar3;
    mtbdd = *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff;
  }
  lVar4 = 0;
LAB_00114909:
  return lVar4 + lVar5;
}

Assistant:

static size_t
mtbdd_leafcount_mark(MTBDD mtbdd)
{
    if (mtbdd == mtbdd_true) return 0; // do not count true/false leaf
    if (mtbdd == mtbdd_false) return 0; // do not count true/false leaf
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (mtbddnode_getmark(n)) return 0;
    mtbddnode_setmark(n, 1);
    if (mtbddnode_isleaf(n)) return 1; // count leaf as 1
    return mtbdd_leafcount_mark(mtbddnode_getlow(n)) + mtbdd_leafcount_mark(mtbddnode_gethigh(n));
}